

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Members * __thiscall Json::Value::getMemberNames_abi_cxx11_(Value *this)

{
  bool bVar1;
  ValueType VVar2;
  uint uVar3;
  reference ppVar4;
  Value *in_RSI;
  Members *in_RDI;
  const_iterator itEnd;
  const_iterator it;
  OStringStream oss;
  Members *members;
  map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *in_stack_fffffffffffffdb8;
  value_type *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdc0;
  String *in_stack_fffffffffffffdd0;
  allocator *paVar5;
  Members *__n;
  allocator local_201;
  string local_200 [32];
  iterator local_1e0;
  _Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> local_1d8;
  iterator local_1d0;
  value_type local_1c8 [2];
  ostringstream local_188 [392];
  
  __n = in_RDI;
  VVar2 = type(in_RSI);
  if ((VVar2 != nullValue) && (VVar2 = type(in_RSI), VVar2 != objectValue)) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    std::operator<<((ostream *)local_188,
                    "in Json::Value::getMemberNames(), value must be objectValue");
    std::__cxx11::ostringstream::str();
    throwLogicError(in_stack_fffffffffffffdd0);
  }
  VVar2 = type(in_RSI);
  if (VVar2 == nullValue) {
    memset(in_RDI,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x2009a0);
  }
  else {
    local_1c8[0]._M_string_length._7_1_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x2009b7);
    std::
    map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::size((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
            *)0x2009c4);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RSI,(size_type)__n);
    local_1d0._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::begin(in_stack_fffffffffffffdb8);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
               local_1c8,&local_1d0);
    local_1e0._M_node =
         (_Base_ptr)
         std::
         map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
         ::end(in_stack_fffffffffffffdb8);
    std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
    _Rb_tree_const_iterator(&local_1d8,&local_1e0);
    while (bVar1 = std::operator!=((_Self *)local_1c8,&local_1d8), bVar1) {
      __x = local_1c8;
      ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*((_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>
                          *)in_stack_fffffffffffffdc0);
      in_stack_fffffffffffffdc0 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)CZString::data(&ppVar4->first);
      ppVar4 = std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::
               operator*((_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>
                          *)in_stack_fffffffffffffdc0);
      uVar3 = CZString::length(&ppVar4->first);
      paVar5 = &local_201;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_200,(char *)in_stack_fffffffffffffdc0,(ulong)uVar3,paVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_stack_fffffffffffffdc0,__x);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
      std::_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_>::operator++
                ((_Rb_tree_const_iterator<std::pair<const_Json::Value::CZString,_Json::Value>_> *)
                 in_stack_fffffffffffffdc0);
    }
  }
  return __n;
}

Assistant:

Value::Members Value::getMemberNames() const {
  JSON_ASSERT_MESSAGE(
      type() == nullValue || type() == objectValue,
      "in Json::Value::getMemberNames(), value must be objectValue");
  if (type() == nullValue)
    return Value::Members();
  Members members;
  members.reserve(value_.map_->size());
  ObjectValues::const_iterator it = value_.map_->begin();
  ObjectValues::const_iterator itEnd = value_.map_->end();
  for (; it != itEnd; ++it) {
    members.push_back(String((*it).first.data(), (*it).first.length()));
  }
  return members;
}